

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O1

MtrNode * Mtr_CreateFirstChild(MtrNode *parent)

{
  MtrNode *pMVar1;
  MtrNode *pMVar2;
  
  pMVar2 = (MtrNode *)malloc(0x30);
  if (pMVar2 == (MtrNode *)0x0) {
    pMVar2 = (MtrNode *)0x0;
  }
  else {
    pMVar2->flags = 0;
    pMVar2->child = (MtrNode *)0x0;
    pMVar2->elder = (MtrNode *)0x0;
    pMVar2->younger = (MtrNode *)0x0;
    pMVar2->parent = parent;
    pMVar1 = parent->child;
    pMVar2->younger = pMVar1;
    pMVar2->elder = (MtrNode *)0x0;
    if (pMVar1 != (MtrNode *)0x0) {
      pMVar1->elder = pMVar2;
    }
    parent->child = pMVar2;
  }
  return pMVar2;
}

Assistant:

MtrNode *
Mtr_CreateFirstChild(
  MtrNode * parent)
{
    MtrNode *child;

    child = Mtr_AllocNode();
    if (child == NULL) return(NULL);

    child->child = child->younger = child-> elder = NULL;
    child->flags = 0;
    Mtr_MakeFirstChild(parent,child);
    return(child);

}